

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall
QXmlStreamReaderPrivate::checkPublicLiteral(QXmlStreamReaderPrivate *this,QStringView publicId)

{
  storage_type_conflict sVar1;
  uint uVar2;
  storage_type_conflict sVar3;
  ulong uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  QAnyStringView a;
  storage_type_conflict local_52;
  QString local_50;
  QString local_38;
  long local_20;
  
  uVar4 = publicId.m_size;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < (long)uVar4) {
    sVar1 = publicId.m_data[uVar4 - 1];
    if ((ushort)sVar1 < 0x100) {
      do {
        sVar3 = sVar1;
        uVar2 = (uint)(ushort)sVar3;
        uVar5 = (uVar2 & 0xff) - 10;
        if ((((0x36 < uVar5) || ((0x6b003fefc00009U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) &&
            ((uVar2 & 0xff) != 0x5f)) &&
           (0x19 < uVar2 - 0x41 && (0x19 < uVar2 - 0x61 && 9 < uVar2 - 0x30))) break;
        if (uVar4 < 2) goto LAB_00391236;
        sVar1 = publicId.m_data[uVar4 - 2];
        uVar4 = uVar4 - 1;
      } while ((ushort)sVar1 < 0x100);
    }
    else {
      sVar3 = L'\0';
    }
    QCoreApplication::translate
              (&local_50,"QXmlStream","Unexpected character \'%1\' in public id literal.",
               (char *)0x0,-1);
    a.m_size = 0x8000000000000001;
    a.field_0.m_data = &local_52;
    local_52 = sVar3;
    QString::arg_impl(&local_38,&local_50,a,0,(QChar)0x20);
    this->error = NotWellFormedError;
    QString::operator=(&this->errorString,&local_38);
    this->type = Invalid;
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
LAB_00391236:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::checkPublicLiteral(QStringView publicId)
{
//#x20 | #xD | #xA | [a-zA-Z0-9] | [-'()+,./:=?;!*#@$_%]

    const char16_t *data = publicId.utf16();
    uchar c = 0;
    qsizetype i;
    for (i = publicId.size() - 1; i >= 0; --i) {
        if (data[i] < 256)
            switch ((c = data[i])) {
            case ' ': case '\n': case '\r': case '-': case '(': case ')':
            case '+': case ',': case '.': case '/': case ':': case '=':
            case '?': case ';': case '!': case '*': case '#': case '@':
            case '$': case '_': case '%': case '\'': case '\"':
                continue;
            default:
                if (isAsciiLetterOrNumber(c))
                    continue;
            }
        break;
    }
    if (i >= 0)
        raiseWellFormedError(QXmlStream::tr("Unexpected character '%1' in public id literal.").arg(QChar(QLatin1Char(c))));
}